

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical_cast.h
# Opt level: O2

Time * Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast
                 (Time *__return_storage_ptr__,char *offset,size_t size)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  time_t tVar6;
  runtime_error *prVar7;
  uint uVar8;
  ulong uVar9;
  tm local_d0;
  undefined1 local_98 [8];
  RawStreamBuf<char> buf;
  ulong local_50;
  ulong local_48;
  anon_class_8_1_50ba0494 local_40;
  anon_class_8_1_50ba0494 parseFragment;
  StreamCursor cursor;
  
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)local_98,offset,size);
  parseFragment.cursor = (StreamCursor *)local_98;
  StreamCursor::advance((StreamCursor *)&parseFragment,0);
  local_40.cursor = (StreamCursor *)&parseFragment;
  uVar3 = cast::anon_class_8_1_50ba0494::operator()
                    (&local_40,2,"Could not parse hours from UTCTimeOnly");
  bVar2 = StreamCursor::advance((StreamCursor *)&parseFragment,1);
  if (!bVar2) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar7,"Could not parse minutes from UTCTimeOnly, expected \':\' got EOF");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = cast::anon_class_8_1_50ba0494::operator()
                    (&local_40,2,"Could not parse minutes from UTCTimeOnly");
  bVar2 = StreamCursor::advance((StreamCursor *)&parseFragment,1);
  if (bVar2) {
    iVar5 = cast::anon_class_8_1_50ba0494::operator()
                      (&local_40,2,"Could not parse seconds from UTCTimeOnly");
    bVar2 = StreamCursor::eof((StreamCursor *)&parseFragment);
    if (bVar2) {
      local_50 = 0;
      uVar9 = 0;
    }
    else {
      StreamCursor::advance((StreamCursor *)&parseFragment,1);
      uVar8 = cast::anon_class_8_1_50ba0494::operator()
                        (&local_40,3,"Could not parse milliseconds from UTCTimeOnly");
      uVar9 = 0x100000000;
      local_50 = (ulong)uVar8;
    }
    bVar2 = StreamCursor::eof((StreamCursor *)&parseFragment);
    buf.super_StreamBuf<char>._56_8_ = __return_storage_ptr__;
    if (bVar2) {
      local_48 = 0;
      uVar8 = 0;
    }
    else {
      uVar8 = cast::anon_class_8_1_50ba0494::operator()
                        (&local_40,3,"Could not parse microseconds from UTCTimeOnly");
      local_48 = 0x100000000;
    }
    local_d0.tm_mon = 0;
    local_d0.tm_year = 0;
    local_d0.tm_gmtoff = 0;
    local_d0.tm_zone = (char *)0x0;
    local_d0.tm_wday = 0;
    local_d0.tm_yday = 0;
    local_d0.tm_isdst = 0;
    local_d0._36_4_ = 0;
    local_d0.tm_mday = 0;
    local_d0.tm_hour = uVar3;
    local_d0.tm_sec = iVar5;
    local_d0.tm_min = iVar4;
    tVar6 = mkgmtime(&local_d0);
    uVar1 = buf.super_StreamBuf<char>._56_8_;
    *(time_t *)buf.super_StreamBuf<char>._56_8_ = tVar6;
    *(ulong *)(buf.super_StreamBuf<char>._56_8_ + 8) = uVar9 | local_50;
    *(ulong *)(buf.super_StreamBuf<char>._56_8_ + 0x10) = uVar8 | local_48;
    std::streambuf::~streambuf((streambuf *)local_98);
    return (Time *)uVar1;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar7,"Could not parse seconds from UTCTimeOnly, expected \':\' got EOF");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Type::UTCTimeOnly::Time cast(const char* offset, size_t size)
            {
                RawStreamBuf<> buf(const_cast<char *>(offset), size);
                StreamCursor cursor(&buf);

                const auto parseFragment = [&](size_t size, const char* error)
                {
                    int value;
                    if (!match_int_fast_n(&value, cursor, size))
                        throw std::runtime_error(error);
                    return value;
                };

                const int hour = parseFragment(2, "Could not parse hours from UTCTimeOnly");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse minutes from UTCTimeOnly, expected ':' got EOF");

                const int min = parseFragment(2, "Could not parse minutes from UTCTimeOnly");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse seconds from UTCTimeOnly, expected ':' got EOF");

                const int sec = parseFragment(2, "Could not parse seconds from UTCTimeOnly");

                std::optional<int> msec;
                if (!cursor.eof())
                {
                    // Literal('.')
                    cursor.advance(1);
                    msec = parseFragment(3, "Could not parse milliseconds from UTCTimeOnly");
                }

                std::optional<int> usec;
                if (!cursor.eof())
                {
                    usec = parseFragment(3, "Could not parse microseconds from UTCTimeOnly");
                }

                std::tm tm{};
                tm.tm_hour = hour;
                tm.tm_min = min;
                tm.tm_sec = sec;

                return {mkgmtime(&tm), msec, usec};
            }